

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

bool __thiscall GenericAssemblerFile::seekVirtual(GenericAssemblerFile *this,int64_t virtualAddress)

{
  uint uVar1;
  fpos<__mbstate_t> local_38;
  streamoff local_28;
  int64_t physicalAddress;
  int64_t virtualAddress_local;
  GenericAssemblerFile *this_local;
  
  physicalAddress = virtualAddress;
  virtualAddress_local = (int64_t)this;
  if (virtualAddress - this->headerSize < 0) {
    Logger::queueError<>(Error,"Seeking to virtual address with negative physical address");
    this_local._7_1_ = false;
  }
  else {
    if (virtualAddress < 0) {
      Logger::queueError<>(Warning,"Seeking to negative virtual address");
    }
    this->virtualAddress = physicalAddress;
    local_28 = physicalAddress - this->headerSize;
    uVar1 = (*(this->super_AssemblerFile)._vptr_AssemblerFile[4])();
    if ((uVar1 & 1) != 0) {
      std::fpos<__mbstate_t>::fpos(&local_38,local_28);
      std::ostream::seekp(&this->stream,local_38._M_off,local_38._M_state);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GenericAssemblerFile::seekVirtual(int64_t virtualAddress)
{
	if (virtualAddress - headerSize < 0)
	{
		Logger::queueError(Logger::Error, "Seeking to virtual address with negative physical address");
		return false;
	}
	if (virtualAddress < 0)
		Logger::queueError(Logger::Warning, "Seeking to negative virtual address");

	this->virtualAddress = virtualAddress;
	int64_t physicalAddress = virtualAddress-headerSize;

	if (isOpen())
		stream.seekp(physicalAddress);

	return true;
}